

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

char * stbtt_GetFontNameString
                 (stbtt_fontinfo *font,int *length,int platformID,int encodingID,int languageID,
                 int nameID)

{
  stbtt_uint8 *data;
  stbtt_uint16 sVar1;
  stbtt_uint16 sVar2;
  stbtt_uint16 sVar3;
  stbtt_uint32 sVar4;
  uint uVar5;
  stbtt_uint32 loc;
  stbtt_uint32 nm;
  stbtt_uint32 offset;
  stbtt_uint8 *fc;
  stbtt_int32 stringOffset;
  stbtt_int32 count;
  stbtt_int32 i;
  int nameID_local;
  int languageID_local;
  int encodingID_local;
  int platformID_local;
  int *length_local;
  stbtt_fontinfo *font_local;
  
  data = font->data;
  sVar4 = stbtt__find_table(data,font->fontstart,"name");
  if (sVar4 != 0) {
    sVar1 = ttUSHORT(data + (ulong)sVar4 + 2);
    sVar2 = ttUSHORT(data + (ulong)sVar4 + 4);
    for (stringOffset = 0; stringOffset < (int)(uint)sVar1; stringOffset = stringOffset + 1) {
      uVar5 = sVar4 + 6 + stringOffset * 0xc;
      sVar3 = ttUSHORT(data + uVar5);
      if ((((platformID == (uint)sVar3) &&
           (sVar3 = ttUSHORT(data + (ulong)uVar5 + 2), encodingID == (uint)sVar3)) &&
          (sVar3 = ttUSHORT(data + (ulong)uVar5 + 4), languageID == (uint)sVar3)) &&
         (sVar3 = ttUSHORT(data + (ulong)uVar5 + 6), nameID == (uint)sVar3)) {
        sVar1 = ttUSHORT(data + (ulong)uVar5 + 8);
        *length = (uint)sVar1;
        sVar1 = ttUSHORT(data + (ulong)uVar5 + 10);
        return (char *)(data + (long)(int)(uint)sVar1 + (long)(int)(sVar4 + sVar2));
      }
    }
  }
  return (char *)0x0;
}

Assistant:

STBTT_DEF const char *stbtt_GetFontNameString(const stbtt_fontinfo *font, int *length, int platformID, int encodingID, int languageID, int nameID)
{
   stbtt_int32 i,count,stringOffset;
   stbtt_uint8 *fc = font->data;
   stbtt_uint32 offset = font->fontstart;
   stbtt_uint32 nm = stbtt__find_table(fc, offset, "name");
   if (!nm) return NULL;

   count = ttUSHORT(fc+nm+2);
   stringOffset = nm + ttUSHORT(fc+nm+4);
   for (i=0; i < count; ++i) {
      stbtt_uint32 loc = nm + 6 + 12 * i;
      if (platformID == ttUSHORT(fc+loc+0) && encodingID == ttUSHORT(fc+loc+2)
          && languageID == ttUSHORT(fc+loc+4) && nameID == ttUSHORT(fc+loc+6)) {
         *length = ttUSHORT(fc+loc+8);
         return (const char *) (fc+stringOffset+ttUSHORT(fc+loc+10));
      }
   }
   return NULL;
}